

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O1

void DiagnoseAncientPolicies
               (vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *ancient,
               uint majorVer,uint minorVer,uint patchVer,cmMakefile *mf)

{
  ostream *poVar1;
  char *pcVar2;
  size_t sVar3;
  PolicyID *pPVar4;
  ostringstream e;
  undefined1 auStack_1d8 [8];
  cmMakefile *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  local_1d0 = mf;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"The project requests behavior compatible with CMake version \"",
             0x3d);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\", which requires the OLD behavior for some policies:\n",0x36);
  pPVar4 = (ancient->super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pPVar4 != (ancient->
                super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      pcVar2 = idToString(*pPVar4);
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
      }
      else {
        sVar3 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,": ",2);
      pcVar2 = idToShortDescription(*pPVar4);
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
      }
      else {
        sVar3 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      pPVar4 = pPVar4 + 1;
    } while (pPVar4 != (ancient->
                       super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"However, this version of CMake no longer supports the OLD ",0x3a)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"behavior for these policies.  ",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Please either update your CMakeLists.txt files to conform to ",
             0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"the new behavior or use an older version of CMake that still ",
             0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"supports the old behavior.",0x1a);
  std::__cxx11::stringbuf::str();
  cmMakefile::IssueMessage(local_1d0,FATAL_ERROR,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

static void DiagnoseAncientPolicies(
  std::vector<cmPolicies::PolicyID> const& ancient, unsigned int majorVer,
  unsigned int minorVer, unsigned int patchVer, cmMakefile* mf)
{
  std::ostringstream e;
  e << "The project requests behavior compatible with CMake version \""
    << majorVer << "." << minorVer << "." << patchVer
    << "\", which requires the OLD behavior for some policies:\n";
  for (std::vector<cmPolicies::PolicyID>::const_iterator i = ancient.begin();
       i != ancient.end(); ++i) {
    e << "  " << idToString(*i) << ": " << idToShortDescription(*i) << "\n";
  }
  e << "However, this version of CMake no longer supports the OLD "
    << "behavior for these policies.  "
    << "Please either update your CMakeLists.txt files to conform to "
    << "the new behavior or use an older version of CMake that still "
    << "supports the old behavior.";
  mf->IssueMessage(cmake::FATAL_ERROR, e.str());
}